

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

void __thiscall
CommandDrawImage::Draw(CommandDrawImage *this,SBarInfoMainBlock *block,DSBarInfo *statusBar)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  SBarInfoCommand **ppSVar4;
  long *plVar5;
  FTexture *texture;
  int forceWidth;
  long lVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  if ((this->flags & 0x80) != 0) {
    bVar1 = (this->super_SBarInfoCommandFlowControl).truth;
    uVar7 = (ulong)(this->super_SBarInfoCommandFlowControl).commands[bVar1].
                   super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count;
    if (uVar7 != 0) {
      ppSVar4 = (this->super_SBarInfoCommandFlowControl).commands[bVar1].
                super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array;
      lVar6 = 0;
      do {
        plVar5 = *(long **)((long)ppSVar4 + lVar6);
        (**(code **)(*plVar5 + 0x10))(plVar5,block,statusBar);
        lVar6 = lVar6 + 8;
      } while (uVar7 << 3 != lVar6);
    }
  }
  texture = this->texture;
  if (texture == (FTexture *)0x0) {
    return;
  }
  forceWidth = this->maxwidth;
  iVar2 = this->maxheight;
  uVar3 = this->flags;
  if ((uVar3 & 0x20) == 0) {
    if (this->applyscale == true) {
      forceWidth = (int)(((double)texture->Width / (texture->Scale).X) * this->spawnScaleX);
    }
    goto LAB_004c2dfe;
  }
  dVar8 = (double)(int)(((double)texture->Width / (texture->Scale).X) * this->spawnScaleX);
  dVar9 = (double)(int)(((double)texture->Height / (texture->Scale).Y) * this->spawnScaleY);
  dVar10 = 1.0;
  dVar11 = 1.0;
  if ((forceWidth != -1) && (((uVar3 & 0x40) != 0 || (dVar11 = 1.0, (double)forceWidth < dVar8)))) {
    dVar11 = (double)forceWidth / dVar8;
  }
  if ((iVar2 != -1) && (((uVar3 & 0x40) != 0 || ((double)iVar2 < dVar9)))) {
    dVar10 = (double)iVar2 / dVar9;
  }
  if ((uVar3 & 0x40) == 0) {
    if (dVar10 < dVar11) {
LAB_004c2de9:
      dVar11 = dVar10;
    }
  }
  else if ((forceWidth == -1) || (iVar2 != -1 && dVar10 < dVar11)) goto LAB_004c2de9;
  forceWidth = (int)(dVar8 * dVar11);
LAB_004c2dfe:
  DSBarInfo::DrawGraphic
            (statusBar,texture,this->imgx,this->imgy,block->xOffset,block->yOffset,
             block->currentAlpha * this->alpha,block->fullScreenOffsets,
             (bool)(this->super_SBarInfoCommandFlowControl).field_0x31,false,this->offset,false,
             forceWidth);
  return;
}

Assistant:

void	Draw(const SBarInfoMainBlock *block, const DSBarInfo *statusBar)
		{
			if(flags & DI_ALTERNATEONFAIL)
				SBarInfoCommandFlowControl::Draw(block, statusBar);

			if(texture == NULL)
				return;

			int w = maxwidth, h = maxheight;
			
			// We must calculate this per frame in order to prevent glitches with cl_capfps true.
			double frameAlpha = block->Alpha() * alpha;
			
			if(flags & DI_DRAWINBOX)
			{
				double scale1, scale2;
				scale1 = scale2 = 1.0f;
				double texwidth = (int) (texture->GetScaledWidthDouble()*spawnScaleX);
				double texheight = (int) (texture->GetScaledHeightDouble()*spawnScaleY);
				
				if (w != -1 && (w<texwidth || (flags & DI_FORCESCALE)))
				{
					scale1 = w/texwidth;
				}
				if (h != -1 && (h<texheight || (flags & DI_FORCESCALE)))
				{
					scale2 = h/texheight;
				}
				
				if (flags & DI_FORCESCALE)
				{
					if (w == -1 || (h != -1 && scale2<scale1))
						scale1=scale2;
				}
				else if (scale2<scale1) scale1=scale2;
				
				w=(int)(texwidth*scale1);
				h=(int)(texheight*scale1);
			}
			else if (applyscale)
			{
				w=(int) (texture->GetScaledWidthDouble()*spawnScaleX);
				h=(int) (texture->GetScaledHeightDouble()*spawnScaleY);
			}
			statusBar->DrawGraphic(texture, imgx, imgy, block->XOffset(), block->YOffset(), frameAlpha, block->FullScreenOffsets(),
				translatable, false, offset, false, w, h);
		}